

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::DescriptorProto::_InternalParse(DescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  DescriptorProto *in_RDX;
  char *in_RSI;
  long in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  char **in_stack_ffffffffffffff68;
  DescriptorProto *in_stack_ffffffffffffff70;
  DescriptorProto *in_stack_ffffffffffffff78;
  DescriptorProto *in_stack_ffffffffffffff80;
  DescriptorProto *in_stack_ffffffffffffff88;
  DescriptorProto *in_stack_ffffffffffffff90;
  DescriptorProto *in_stack_ffffffffffffff98;
  uint local_3c;
  HasBits<1UL> local_2c;
  DescriptorProto *local_28;
  char *local_20;
  HasBits<1UL> *local_10;
  HasBits<1UL> *local_8;
  
  local_10 = &local_2c;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_8 = local_10;
  memset(local_10,0,4);
  GetArenaNoVirtual(in_stack_ffffffffffffff70);
LAB_005163a6:
  do {
    bVar1 = internal::ParseContext::Done
                      ((ParseContext *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00516a79;
    local_20 = internal::ReadTag((char *)in_stack_ffffffffffffff98,
                                 (uint32 *)in_stack_ffffffffffffff90,
                                 (uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (local_20 == (char *)0x0) goto LAB_00516a99;
    switch(local_3c >> 3) {
    case 1:
      if ((local_3c & 0xff) != 10) break;
      _internal_mutable_name_abi_cxx11_(in_stack_ffffffffffffff80);
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                            (ParseContext *)in_stack_ffffffffffffff80,
                            (char *)in_stack_ffffffffffffff78);
      goto joined_r0x00516466;
    case 2:
      if ((local_3c & 0xff) == 0x12) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_field((DescriptorProto *)0x5164c5);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff88,
                                (FieldDescriptorProto *)in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (char *)0x0) goto LAB_00516a99;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<18u>(local_20), bVar1));
        goto LAB_005163a6;
      }
      break;
    case 3:
      if ((local_3c & 0xff) == 0x1a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_nested_type((DescriptorProto *)0x51656d);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (char *)0x0) goto LAB_00516a99;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<26u>(local_20), bVar1));
        goto LAB_005163a6;
      }
      break;
    case 4:
      if ((local_3c & 0xff) == 0x22) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff98 = local_28;
          _internal_add_enum_type((DescriptorProto *)0x516615);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff88,
                                (EnumDescriptorProto *)in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (char *)0x0) goto LAB_00516a99;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<34u>(local_20), bVar1));
        goto LAB_005163a6;
      }
      break;
    case 5:
      if ((local_3c & 0xff) == 0x2a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff90 = local_28;
          _internal_add_extension_range((DescriptorProto *)0x5166bd);
          local_20 = internal::ParseContext::
                     ParseMessage<google::protobuf::DescriptorProto_ExtensionRange>
                               ((ParseContext *)in_stack_ffffffffffffff88,
                                (DescriptorProto_ExtensionRange *)in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (char *)0x0) goto LAB_00516a99;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<42u>(local_20), bVar1));
        goto LAB_005163a6;
      }
      break;
    case 6:
      if ((local_3c & 0xff) == 0x32) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff88 = local_28;
          _internal_add_extension((DescriptorProto *)0x516765);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff88,
                                (FieldDescriptorProto *)in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (char *)0x0) goto LAB_00516a99;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<50u>(local_20), bVar1));
        goto LAB_005163a6;
      }
      break;
    case 7:
      if ((local_3c & 0xff) == 0x3a) {
        in_stack_ffffffffffffff80 = local_28;
        _internal_mutable_options(in_stack_ffffffffffffff70);
        local_20 = internal::ParseContext::ParseMessage<google::protobuf::MessageOptions>
                             ((ParseContext *)in_stack_ffffffffffffff88,
                              (MessageOptions *)in_stack_ffffffffffffff80,
                              (char *)in_stack_ffffffffffffff78);
        goto joined_r0x00516466;
      }
      break;
    case 8:
      if ((local_3c & 0xff) == 0x42) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff78 = local_28;
          _internal_add_oneof_decl((DescriptorProto *)0x516871);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::OneofDescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff88,
                                (OneofDescriptorProto *)in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (char *)0x0) goto LAB_00516a99;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<66u>(local_20), bVar1));
        goto LAB_005163a6;
      }
      break;
    case 9:
      if ((local_3c & 0xff) == 0x4a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff70 = local_28;
          _internal_add_reserved_range((DescriptorProto *)0x516919);
          local_20 = internal::ParseContext::
                     ParseMessage<google::protobuf::DescriptorProto_ReservedRange>
                               ((ParseContext *)in_stack_ffffffffffffff88,
                                (DescriptorProto_ReservedRange *)in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (char *)0x0) goto LAB_00516a99;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<74u>(local_20), bVar1));
        goto LAB_005163a6;
      }
      break;
    case 10:
      if ((local_3c & 0xff) == 0x52) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_reserved_name_abi_cxx11_((DescriptorProto *)0x5169b7);
          local_20 = internal::InlineGreedyStringParserUTF8Verify
                               ((string *)in_stack_ffffffffffffff90,
                                (char *)in_stack_ffffffffffffff88,
                                (ParseContext *)in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (char *)0x0) goto LAB_00516a99;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<82u>(local_20), bVar1));
        goto LAB_005163a6;
      }
    }
    if (((local_3c & 7) == 4) || (local_3c == 0)) {
      internal::EpsCopyInputStream::SetLastTag((EpsCopyInputStream *)local_28,local_3c);
      goto LAB_00516a79;
    }
    local_20 = internal::UnknownFieldParse
                         ((uint32)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          (InternalMetadataWithArena *)in_stack_ffffffffffffff88,
                          (char *)in_stack_ffffffffffffff80,
                          (ParseContext *)in_stack_ffffffffffffff78);
joined_r0x00516466:
    if (local_20 == (char *)0x0) {
LAB_00516a99:
      local_20 = (char *)0x0;
LAB_00516a79:
      internal::HasBits<1UL>::Or((HasBits<1UL> *)(in_RDI + 0x10),&local_2c);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* DescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.DescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_field(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nested_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MessageOptions options = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_oneof_decl(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_reserved_name(), ptr, ctx, "google.protobuf.DescriptorProto.reserved_name");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}